

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::StartEmitBlock(ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock)

{
  Scope *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FuncInfo *funcInfo_00;
  FuncInfo *funcInfo;
  Scope *scope;
  ParseNodeBlock *pnodeBlock_local;
  ByteCodeGenerator *this_local;
  
  bVar2 = BlockHasOwnScope(pnodeBlock,this);
  if (bVar2) {
    if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xff6,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    PushBlock(this,pnodeBlock);
    this_00 = pnodeBlock->scope;
    bVar2 = ParseNodeBlock::GetCallsEval(pnodeBlock);
    if ((((bVar2) || (bVar2 = ParseNodeBlock::GetChildCallsEval(pnodeBlock), bVar2)) ||
        ((this->flags & 0x404) != 0)) && (bVar2 = Scope::GetIsObject(this_00), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xffd,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = Scope::GetMustInstantiate(this_00);
    if (bVar2) {
      funcInfo_00 = Scope::GetFunc(this_00);
      EnsureFncScopeSlots(this,pnodeBlock->pnodeScopes,funcInfo_00);
      EnsureLetConstScopeSlots(this,pnodeBlock,funcInfo_00);
      PushScope(this,this_00);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitBlock(ParseNodeBlock *pnodeBlock)
{
    if (!BlockHasOwnScope(pnodeBlock, this))
    {
        return;
    }

    Assert(pnodeBlock->nop == knopBlock);

    PushBlock(pnodeBlock);

    Scope *scope = pnodeBlock->scope;
    if (pnodeBlock->GetCallsEval() || pnodeBlock->GetChildCallsEval() || (this->flags & (fscrEval | fscrImplicitThis)))
    {
        Assert(scope->GetIsObject());
    }

    // TODO: Consider nested deferred parsing.
    if (scope->GetMustInstantiate())
    {
        FuncInfo *funcInfo = scope->GetFunc();
        this->EnsureFncScopeSlots(pnodeBlock->pnodeScopes, funcInfo);
        this->EnsureLetConstScopeSlots(pnodeBlock, funcInfo);
        PushScope(scope);
    }
}